

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int yaml_parser_parse(yaml_parser_t *parser,yaml_event_t *event)

{
  yaml_parser_state_t **ppyVar1;
  yaml_token_type_t yVar2;
  yaml_char_t *ptr;
  yaml_tag_directive_t *pyVar3;
  size_t sVar4;
  size_t sVar5;
  yaml_mark_t mark;
  yaml_mark_t mark_00;
  int iVar6;
  yaml_token_t *pyVar7;
  yaml_parser_state_t *pyVar8;
  int indentless_sequence;
  yaml_encoding_t yVar9;
  size_t sVar10;
  yaml_mark_t start_mark;
  size_t local_38;
  size_t sStack_30;
  size_t local_28;
  
  if (parser == (yaml_parser_t *)0x0) {
    __assert_fail("parser",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/parser.c"
                  ,0xac,"int yaml_parser_parse(yaml_parser_t *, yaml_event_t *)");
  }
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/parser.c"
                  ,0xad,"int yaml_parser_parse(yaml_parser_t *, yaml_event_t *)");
  }
  (event->end_mark).index = 0;
  (event->end_mark).line = 0;
  (event->start_mark).line = 0;
  (event->start_mark).column = 0;
  *(undefined8 *)((long)&event->data + 0x28) = 0;
  (event->start_mark).index = 0;
  (event->data).scalar.length = 0;
  *(undefined8 *)((long)&event->data + 0x20) = 0;
  (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
  (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
  (event->end_mark).column = 0;
  *(undefined8 *)event = 0;
  (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
  iVar6 = 1;
  if (parser->stream_end_produced != 0) {
    return 1;
  }
  if (parser->error != YAML_NO_ERROR) {
    return 1;
  }
  switch(parser->state) {
  case YAML_PARSE_STREAM_START_STATE:
    if ((parser->token_available != 0) ||
       (iVar6 = yaml_parser_fetch_more_tokens(parser), iVar6 != 0)) {
      pyVar7 = (parser->tokens).head;
      if (pyVar7 == (yaml_token_t *)0x0) {
        return 0;
      }
      if (pyVar7->type == YAML_STREAM_START_TOKEN) {
        parser->state = YAML_PARSE_IMPLICIT_DOCUMENT_START_STATE;
        *(undefined8 *)event = 0;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->end_mark).index = 0;
        (event->end_mark).line = 0;
        (event->start_mark).line = 0;
        (event->start_mark).column = 0;
        *(undefined8 *)((long)&event->data + 0x28) = 0;
        (event->start_mark).index = 0;
        (event->end_mark).column = 0;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        event->type = YAML_STREAM_START_EVENT;
        (event->start_mark).column = (pyVar7->start_mark).column;
        sVar10 = (pyVar7->start_mark).line;
        (event->start_mark).index = (pyVar7->start_mark).index;
        (event->start_mark).line = sVar10;
        sVar10 = (pyVar7->start_mark).line;
        (event->end_mark).index = (pyVar7->start_mark).index;
        (event->end_mark).line = sVar10;
        (event->end_mark).column = (pyVar7->start_mark).column;
        (event->data).stream_start.encoding = (pyVar7->data).stream_start.encoding;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        pyVar7 = (parser->tokens).head;
        parser->stream_end_produced = (uint)(pyVar7->type == YAML_STREAM_END_TOKEN);
        (parser->tokens).head = pyVar7 + 1;
        return 1;
      }
      sVar10 = (pyVar7->start_mark).column;
      sVar4 = (pyVar7->start_mark).index;
      sVar5 = (pyVar7->start_mark).line;
      parser->error = YAML_PARSER_ERROR;
      parser->problem = "did not find expected <stream-start>";
      (parser->problem_mark).index = sVar4;
      (parser->problem_mark).line = sVar5;
      (parser->problem_mark).column = sVar10;
      return 0;
    }
    break;
  case YAML_PARSE_IMPLICIT_DOCUMENT_START_STATE:
    iVar6 = 1;
    goto LAB_0010a0c0;
  case YAML_PARSE_DOCUMENT_START_STATE:
    iVar6 = 0;
LAB_0010a0c0:
    iVar6 = yaml_parser_parse_document_start(parser,event,iVar6);
    return iVar6;
  case YAML_PARSE_DOCUMENT_CONTENT_STATE:
    if (((parser->token_available != 0) ||
        (iVar6 = yaml_parser_fetch_more_tokens(parser), iVar6 != 0)) &&
       (pyVar7 = (parser->tokens).head, pyVar7 != (yaml_token_t *)0x0)) {
      if (pyVar7->type - YAML_STREAM_END_TOKEN < 5) {
        pyVar8 = (parser->states).top;
        (parser->states).top = pyVar8 + -1;
        parser->state = pyVar8[-1];
        goto LAB_0010a3d8;
      }
      goto switchD_00109e2f_caseD_5;
    }
    break;
  case YAML_PARSE_DOCUMENT_END_STATE:
    if (((parser->token_available != 0) ||
        (iVar6 = yaml_parser_fetch_more_tokens(parser), iVar6 != 0)) &&
       (pyVar7 = (parser->tokens).head, pyVar7 != (yaml_token_t *)0x0)) {
      local_28 = (pyVar7->start_mark).column;
      local_38 = (pyVar7->start_mark).index;
      sStack_30 = (pyVar7->start_mark).line;
      sVar10 = (pyVar7->start_mark).column;
      sVar4 = (pyVar7->start_mark).index;
      sVar5 = (pyVar7->start_mark).line;
      if (pyVar7->type == YAML_DOCUMENT_END_TOKEN) {
        local_28 = (pyVar7->end_mark).column;
        local_38 = (pyVar7->end_mark).index;
        sStack_30 = (pyVar7->end_mark).line;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar7 + 1;
        yVar9 = YAML_ANY_ENCODING;
      }
      else {
        yVar9 = YAML_UTF8_ENCODING;
      }
      while (pyVar3 = (parser->tag_directives).top, (parser->tag_directives).start != pyVar3) {
        (parser->tag_directives).top = pyVar3 + -1;
        ptr = pyVar3[-1].prefix;
        yaml_free(pyVar3[-1].handle);
        yaml_free(ptr);
      }
      parser->state = YAML_PARSE_DOCUMENT_START_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      event->type = YAML_DOCUMENT_END_EVENT;
      (event->start_mark).index = sVar4;
      (event->start_mark).line = sVar5;
      (event->start_mark).column = sVar10;
      (event->end_mark).index = local_38;
      (event->end_mark).line = sStack_30;
      (event->end_mark).column = local_28;
      (event->data).stream_start.encoding = yVar9;
      return 1;
    }
    break;
  case YAML_PARSE_BLOCK_NODE_STATE:
switchD_00109e2f_caseD_5:
    iVar6 = 1;
    goto LAB_0010a5bf;
  case YAML_PARSE_BLOCK_NODE_OR_INDENTLESS_SEQUENCE_STATE:
    indentless_sequence = 1;
    iVar6 = indentless_sequence;
    goto LAB_0010a5c1;
  case YAML_PARSE_FLOW_NODE_STATE:
switchD_00109e2f_caseD_7:
    iVar6 = 0;
LAB_0010a5bf:
    indentless_sequence = 0;
LAB_0010a5c1:
    iVar6 = yaml_parser_parse_node(parser,event,iVar6,indentless_sequence);
    return iVar6;
  case YAML_PARSE_BLOCK_SEQUENCE_FIRST_ENTRY_STATE:
    iVar6 = 1;
    goto LAB_0010a33e;
  case YAML_PARSE_BLOCK_SEQUENCE_ENTRY_STATE:
    iVar6 = 0;
LAB_0010a33e:
    iVar6 = yaml_parser_parse_block_sequence_entry(parser,event,iVar6);
    return iVar6;
  case YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE:
    if (((parser->token_available != 0) ||
        (iVar6 = yaml_parser_fetch_more_tokens(parser), iVar6 != 0)) &&
       (pyVar7 = (parser->tokens).head, pyVar7 != (yaml_token_t *)0x0)) {
      if (pyVar7->type == YAML_BLOCK_ENTRY_TOKEN) {
        start_mark.column = (pyVar7->end_mark).column;
        start_mark.index = (pyVar7->end_mark).index;
        start_mark.line = (pyVar7->end_mark).line;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar7 + 1;
        iVar6 = yaml_parser_fetch_more_tokens(parser);
        if (iVar6 == 0) {
          return 0;
        }
        pyVar7 = (parser->tokens).head;
        if (pyVar7 == (yaml_token_t *)0x0) {
          return 0;
        }
        yVar2 = pyVar7->type;
        if ((YAML_VALUE_TOKEN < yVar2) ||
           ((0x34200U >> (yVar2 & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) == 0)) {
          pyVar8 = (parser->states).top;
          if (pyVar8 == (parser->states).end) {
            ppyVar1 = &(parser->states).top;
            iVar6 = yaml_stack_extend(&(parser->states).start,ppyVar1,&(parser->states).end);
            if (iVar6 == 0) goto LAB_0010a67c;
            pyVar8 = *ppyVar1;
          }
          (parser->states).top = pyVar8 + 1;
          *pyVar8 = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
          iVar6 = 0;
LAB_0010a672:
          iVar6 = yaml_parser_parse_node(parser,event,1,iVar6);
          return iVar6;
        }
        parser->state = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
LAB_0010a054:
        mark.line._0_4_ = (int)start_mark.line;
        mark.index = start_mark.index;
        mark.line._4_4_ = (int)(start_mark.line >> 0x20);
        mark.column = start_mark.column;
        iVar6 = yaml_parser_process_empty_scalar(parser,event,mark);
        return iVar6;
      }
      pyVar8 = (parser->states).top;
      (parser->states).top = pyVar8 + -1;
      parser->state = pyVar8[-1];
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_SEQUENCE_END_EVENT;
LAB_0010a43a:
      sVar10 = (pyVar7->start_mark).line;
      (event->start_mark).index = (pyVar7->start_mark).index;
      (event->start_mark).line = sVar10;
      (event->start_mark).column = (pyVar7->start_mark).column;
      sVar10 = (pyVar7->start_mark).line;
      (event->end_mark).index = (pyVar7->start_mark).index;
      (event->end_mark).line = sVar10;
      (event->end_mark).column = (pyVar7->start_mark).column;
      return 1;
    }
    break;
  case YAML_PARSE_BLOCK_MAPPING_FIRST_KEY_STATE:
    iVar6 = 1;
    goto LAB_0010a204;
  case YAML_PARSE_BLOCK_MAPPING_KEY_STATE:
    iVar6 = 0;
LAB_0010a204:
    iVar6 = yaml_parser_parse_block_mapping_key(parser,event,iVar6);
    return iVar6;
  case YAML_PARSE_BLOCK_MAPPING_VALUE_STATE:
    if (((parser->token_available != 0) ||
        (iVar6 = yaml_parser_fetch_more_tokens(parser), iVar6 != 0)) &&
       (pyVar7 = (parser->tokens).head, pyVar7 != (yaml_token_t *)0x0)) {
      if (pyVar7->type == YAML_VALUE_TOKEN) {
        start_mark.column = (pyVar7->end_mark).column;
        start_mark.index = (pyVar7->end_mark).index;
        start_mark.line = (pyVar7->end_mark).line;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar7 + 1;
        iVar6 = yaml_parser_fetch_more_tokens(parser);
        if (iVar6 == 0) {
          return 0;
        }
        pyVar7 = (parser->tokens).head;
        if (pyVar7 == (yaml_token_t *)0x0) {
          return 0;
        }
        yVar2 = pyVar7->type;
        if ((YAML_VALUE_TOKEN < yVar2) ||
           ((0x30200U >> (yVar2 & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) == 0)) {
          pyVar8 = (parser->states).top;
          if (pyVar8 == (parser->states).end) {
            ppyVar1 = &(parser->states).top;
            iVar6 = yaml_stack_extend(&(parser->states).start,ppyVar1,&(parser->states).end);
            if (iVar6 == 0) goto LAB_0010a67c;
            pyVar8 = *ppyVar1;
          }
          (parser->states).top = pyVar8 + 1;
          *pyVar8 = YAML_PARSE_BLOCK_MAPPING_KEY_STATE;
          iVar6 = 1;
          goto LAB_0010a672;
        }
        parser->state = YAML_PARSE_BLOCK_MAPPING_KEY_STATE;
        goto LAB_0010a054;
      }
      parser->state = YAML_PARSE_BLOCK_MAPPING_KEY_STATE;
LAB_0010a3d8:
      sVar10 = (pyVar7->start_mark).column;
      start_mark.index._0_4_ = (undefined4)(pyVar7->start_mark).index;
      start_mark.index._4_4_ = *(undefined4 *)((long)&(pyVar7->start_mark).index + 4);
      start_mark.line._0_4_ = (undefined4)(pyVar7->start_mark).line;
      start_mark.line._4_4_ = *(undefined4 *)((long)&(pyVar7->start_mark).line + 4);
LAB_0010a3e5:
      mark_00.index._4_4_ = start_mark.index._4_4_;
      mark_00.index._0_4_ = (undefined4)start_mark.index;
      mark_00.line._0_4_ = (undefined4)start_mark.line;
      mark_00.line._4_4_ = start_mark.line._4_4_;
      mark_00.column = sVar10;
      iVar6 = yaml_parser_process_empty_scalar(parser,event,mark_00);
      return iVar6;
    }
    break;
  case YAML_PARSE_FLOW_SEQUENCE_FIRST_ENTRY_STATE:
    iVar6 = 1;
    goto LAB_0010a0a9;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE:
    iVar6 = 0;
LAB_0010a0a9:
    iVar6 = yaml_parser_parse_flow_sequence_entry(parser,event,iVar6);
    return iVar6;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_KEY_STATE:
    if ((parser->token_available != 0) ||
       (iVar6 = yaml_parser_fetch_more_tokens(parser), iVar6 != 0)) {
      pyVar7 = (parser->tokens).head;
      if (pyVar7 == (yaml_token_t *)0x0) {
        return 0;
      }
      if ((pyVar7->type < YAML_ALIAS_TOKEN) &&
         ((0x28800U >> (pyVar7->type & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) != 0)) {
        sVar10 = (pyVar7->end_mark).column;
        sVar4 = (pyVar7->end_mark).index;
        sVar5 = (pyVar7->end_mark).line;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar7 + 1;
        parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_VALUE_STATE;
        start_mark.index._0_4_ = (undefined4)sVar4;
        start_mark.index._4_4_ = (undefined4)(sVar4 >> 0x20);
        start_mark.line._0_4_ = (undefined4)sVar5;
        start_mark.line._4_4_ = (undefined4)(sVar5 >> 0x20);
        goto LAB_0010a3e5;
      }
      pyVar8 = (parser->states).top;
      if (pyVar8 == (parser->states).end) {
        ppyVar1 = &(parser->states).top;
        iVar6 = yaml_stack_extend(&(parser->states).start,ppyVar1,&(parser->states).end);
        if (iVar6 == 0) {
LAB_0010a67c:
          parser->error = YAML_MEMORY_ERROR;
          return 0;
        }
        pyVar8 = *ppyVar1;
      }
      (parser->states).top = pyVar8 + 1;
      *pyVar8 = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_VALUE_STATE;
      goto switchD_00109e2f_caseD_7;
    }
    break;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_VALUE_STATE:
    if ((parser->token_available != 0) ||
       (iVar6 = yaml_parser_fetch_more_tokens(parser), iVar6 != 0)) {
      pyVar7 = (parser->tokens).head;
      if (pyVar7 == (yaml_token_t *)0x0) {
        return 0;
      }
      if (pyVar7->type == YAML_VALUE_TOKEN) {
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar7 + 1;
        iVar6 = yaml_parser_fetch_more_tokens(parser);
        if (iVar6 == 0) {
          return 0;
        }
        pyVar7 = (parser->tokens).head;
        if (pyVar7 == (yaml_token_t *)0x0) {
          return 0;
        }
        if ((pyVar7->type | YAML_TAG_DIRECTIVE_TOKEN) != YAML_FLOW_ENTRY_TOKEN) {
          pyVar8 = (parser->states).top;
          if (pyVar8 == (parser->states).end) {
            ppyVar1 = &(parser->states).top;
            iVar6 = yaml_stack_extend(&(parser->states).start,ppyVar1,&(parser->states).end);
            if (iVar6 == 0) goto LAB_0010a67c;
            pyVar8 = *ppyVar1;
          }
          (parser->states).top = pyVar8 + 1;
          *pyVar8 = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_END_STATE;
          goto switchD_00109e2f_caseD_7;
        }
      }
      parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_END_STATE;
      goto LAB_0010a3d8;
    }
    break;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_END_STATE:
    if (((parser->token_available != 0) ||
        (iVar6 = yaml_parser_fetch_more_tokens(parser), iVar6 != 0)) &&
       (pyVar7 = (parser->tokens).head, pyVar7 != (yaml_token_t *)0x0)) {
      parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_MAPPING_END_EVENT;
      goto LAB_0010a43a;
    }
    break;
  case YAML_PARSE_FLOW_MAPPING_FIRST_KEY_STATE:
    iVar6 = 1;
    goto LAB_0010a1ed;
  case YAML_PARSE_FLOW_MAPPING_KEY_STATE:
    iVar6 = 0;
LAB_0010a1ed:
    iVar6 = yaml_parser_parse_flow_mapping_key(parser,event,iVar6);
    return iVar6;
  case YAML_PARSE_FLOW_MAPPING_VALUE_STATE:
    iVar6 = 0;
    goto LAB_0010a3be;
  case YAML_PARSE_FLOW_MAPPING_EMPTY_VALUE_STATE:
    iVar6 = 1;
LAB_0010a3be:
    iVar6 = yaml_parser_parse_flow_mapping_value(parser,event,iVar6);
    return iVar6;
  case YAML_PARSE_END_STATE:
    goto switchD_00109e2f_caseD_17;
  }
  iVar6 = 0;
switchD_00109e2f_caseD_17:
  return iVar6;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_parse(yaml_parser_t *parser, yaml_event_t *event)
{
    assert(parser);     /* Non-NULL parser object is expected. */
    assert(event);      /* Non-NULL event object is expected. */

    /* Erase the event object. */

    memset(event, 0, sizeof(yaml_event_t));

    /* No events after the end of the stream or error. */

    if (parser->stream_end_produced || parser->error ||
            parser->state == YAML_PARSE_END_STATE) {
        return 1;
    }

    /* Generate the next event. */

    return yaml_parser_state_machine(parser, event);
}